

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O1

void t4(void)

{
  uint uVar1;
  int __fd;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  uint got;
  int got_00;
  gpioReport_t r;
  char p [32];
  ushort local_64 [4];
  uint local_5c;
  char local_58 [40];
  
  puts("Pipe notification tests.");
  got = 0;
  set_PWM_frequency(0x19,0);
  set_PWM_dutycycle(0x19,0);
  set_PWM_range(0x19,100);
  uVar1 = notify_open();
  sprintf(local_58,"/dev/pigpio%d",(ulong)uVar1);
  __fd = open(local_58,0);
  iVar2 = notify_begin(uVar1,0x2000000);
  got_00 = 1;
  CHECK(4,1,iVar2,0,0,"notify open/begin");
  set_PWM_dutycycle(0x19,0x32);
  time_sleep(0x4010000000000000);
  set_PWM_dutycycle(0x19,0);
  iVar2 = notify_pause(uVar1);
  CHECK(4,2,iVar2,0,0,"notify pause");
  iVar2 = notify_close(uVar1);
  CHECK(4,3,iVar2,0,0,"notify close");
  sVar4 = read(__fd,local_64,0xc);
  iVar2 = 1;
  if ((int)sVar4 == 0xc) {
    got_00 = 1;
    uVar1 = 0;
    got = 0;
    do {
      if (got != local_64[0]) {
        got_00 = 0;
      }
      iVar3 = 0;
      if (uVar1 == (local_5c & 0x2000000)) {
        iVar3 = iVar2;
      }
      if (got != 0) {
        iVar2 = iVar3;
      }
      uVar1 = local_5c & 0x2000000 ^ 0x2000000;
      got = got + 1;
      sVar4 = read(__fd,local_64,0xc);
    } while ((int)sVar4 == 0xc);
  }
  close(__fd);
  CHECK(4,4,got_00,1,0,"sequence numbers ok");
  CHECK(4,5,iVar2,1,0,"gpio toggled ok");
  CHECK(4,6,got,0x50,10,"number of notifications");
  return;
}

Assistant:

void t4()
{
   int h, e, f, n, s, b, l, seq_ok, toggle_ok;
   gpioReport_t r;
   char p[32];

   printf("Pipe notification tests.\n");

   set_PWM_frequency(GPIO, 0);
   set_PWM_dutycycle(GPIO, 0);
   set_PWM_range(GPIO, 100);

   h = notify_open();

   sprintf(p, "/dev/pigpio%d", h);
   f = open(p, O_RDONLY);

   e = notify_begin(h, (1<<GPIO));
   CHECK(4, 1, e, 0, 0, "notify open/begin");

   set_PWM_dutycycle(GPIO, 50);
   time_sleep(4);
   set_PWM_dutycycle(GPIO, 0);

   e = notify_pause(h);
   CHECK(4, 2, e, 0, 0, "notify pause");

   e = notify_close(h);
   CHECK(4, 3, e, 0, 0, "notify close");

   n = 0;
   s = 0;
   l = 0;
   seq_ok = 1;
   toggle_ok = 1;

   while (1)
   {
      b = read(f, &r, 12);
      if (b == 12)
      {
         if (s != r.seqno) seq_ok = 0;

         if (n) if (l != (r.level&(1<<GPIO))) toggle_ok = 0;

         if (r.level&(1<<GPIO)) l = 0;
         else                   l = (1<<GPIO);
           
         s++;
         n++;

         // printf("%d %d %d %X\n", r.seqno, r.flags, r.tick, r.level);
      }
      else break;
   }
   close(f);
 
   CHECK(4, 4, seq_ok, 1, 0, "sequence numbers ok");

   CHECK(4, 5, toggle_ok, 1, 0, "gpio toggled ok");

   CHECK(4, 6, n, 80, 10, "number of notifications");
}